

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  char cVar1;
  bool bVar2;
  Curl_addrinfo *pCVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  Curl_addrinfo *ai;
  size_t alen;
  _Bool error;
  unsigned_long tmp_port;
  char *host_end;
  char *host_begin;
  char *pcStack_2d0;
  _Bool permanent;
  char *end_ptr;
  char *port_ptr;
  char *addr_end;
  char *addr_begin;
  char *addresses;
  char address [64];
  size_t entry_len_1;
  Curl_addrinfo *tail;
  Curl_addrinfo *head;
  Curl_dns_entry *dns;
  size_t entry_len;
  char entry_id [262];
  char local_128 [4];
  int port;
  char hostname [256];
  curl_slist *local_20;
  curl_slist *hostp;
  Curl_easy *data_local;
  
  stack0xfffffffffffffed4 = 0;
  *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfff7ffff;
  local_20 = (data->state).resolve;
  do {
    if (local_20 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    if (local_20->data != (char *)0x0) {
      if (*local_20->data == '-') {
        iVar4 = __isoc99_sscanf(local_20->data + 1,"%255[^:]:%d",local_128,entry_id + 0x104);
        if (iVar4 == 2) {
          create_hostcache_id(local_128,stack0xfffffffffffffed4,(char *)&entry_len,0x106);
          sVar5 = strlen((char *)&entry_len);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,&entry_len,sVar5 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'",local_20->data);
        }
      }
      else {
        tail = (Curl_addrinfo *)0x0;
        entry_len_1 = 0;
        addr_begin = (char *)0x0;
        bVar2 = true;
        host_end = local_20->data;
        cVar1 = *host_end;
        if (cVar1 == '+') {
          host_end = host_end + 1;
        }
        host_begin._7_1_ = cVar1 != '+';
        pcVar6 = strchr(host_end,0x3a);
        if ((pcVar6 != (char *)0x0) && ((long)pcVar6 - (long)host_end < 0x100)) {
          memcpy(local_128,host_end,(long)pcVar6 - (long)host_end);
          pcVar6[(long)(local_128 + -(long)host_end)] = '\0';
          end_ptr = pcVar6 + 1;
          uVar7 = strtoul(end_ptr,&stack0xfffffffffffffd30,10);
          if ((uVar7 < 0x10000) && ((pcStack_2d0 != end_ptr && (*pcStack_2d0 == ':')))) {
            register0x00000000 = (uint)uVar7;
            addr_begin = pcStack_2d0 + 1;
            pCVar8 = (Curl_addrinfo *)entry_len_1;
            pCVar3 = tail;
            while (tail = pCVar3, entry_len_1 = (size_t)pCVar8, *pcStack_2d0 != '\0') {
              addr_end = pcStack_2d0 + 1;
              port_ptr = strchr(addr_end,0x2c);
              pcVar6 = addr_end;
              if (port_ptr == (char *)0x0) {
                sVar5 = strlen(addr_end);
                port_ptr = pcVar6 + sVar5;
              }
              pcStack_2d0 = port_ptr;
              if (*addr_end == '[') {
                if ((port_ptr == addr_end) || (port_ptr[-1] != ']')) goto LAB_00900358;
                addr_end = addr_end + 1;
                port_ptr = port_ptr + -1;
              }
              uVar7 = (long)port_ptr - (long)addr_end;
              pCVar8 = (Curl_addrinfo *)entry_len_1;
              pCVar3 = tail;
              if (uVar7 != 0) {
                if (0x3f < uVar7) goto LAB_00900358;
                memcpy(&addresses,addr_end,uVar7);
                address[uVar7 - 8] = '\0';
                pCVar8 = Curl_str2addr((char *)&addresses,stack0xfffffffffffffed4);
                if (pCVar8 == (Curl_addrinfo *)0x0) {
                  Curl_infof(data,"Resolve address \'%s\' found illegal",&addresses);
                  goto LAB_00900358;
                }
                pCVar3 = pCVar8;
                if (entry_len_1 != 0) {
                  *(Curl_addrinfo **)(entry_len_1 + 0x28) = pCVar8;
                  pCVar8 = (Curl_addrinfo *)*(size_t *)(entry_len_1 + 0x28);
                  pCVar3 = tail;
                }
              }
            }
            if (tail != (Curl_addrinfo *)0x0) {
              bVar2 = false;
            }
          }
        }
LAB_00900358:
        if (bVar2) {
          Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",local_20->data);
          Curl_freeaddrinfo(tail);
          return CURLE_SETOPT_OPTION_SYNTAX;
        }
        create_hostcache_id(local_128,stack0xfffffffffffffed4,(char *)&entry_len,0x106);
        sVar5 = strlen((char *)&entry_len);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pvVar9 = Curl_hash_pick((data->dns).hostcache,&entry_len,sVar5 + 1);
        if (pvVar9 != (void *)0x0) {
          Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded",local_128,
                     (ulong)stack0xfffffffffffffed4);
          Curl_hash_delete((data->dns).hostcache,&entry_len,sVar5 + 1);
        }
        pCVar10 = Curl_cache_addr(data,tail,local_128,stack0xfffffffffffffed4);
        if (pCVar10 != (Curl_dns_entry *)0x0) {
          if (host_begin._7_1_) {
            pCVar10->timestamp = 0;
          }
          pCVar10->inuse = pCVar10->inuse + -1;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar10 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(tail);
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar6 = " (non-permanent)";
        if (host_begin._7_1_) {
          pcVar6 = "";
        }
        Curl_infof(data,"Added %s:%d:%s to DNS cache%s",local_128,(ulong)stack0xfffffffffffffed4,
                   addr_begin,pcVar6);
        if ((local_128[0] == '*') && (local_128[1] == '\0')) {
          Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks",local_128,
                     (ulong)stack0xfffffffffffffed4);
          *(uint *)&(data->state).field_0x6d0 =
               *(uint *)&(data->state).field_0x6d0 & 0xfff7ffff | 0x80000;
        }
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = false;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      bool permanent = TRUE;
      char *host_begin;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_begin = hostp->data;
      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end ||
         ((host_end - host_begin) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, host_begin, host_end - host_begin);
      hostname[host_end - host_begin] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it's already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded",
              hostname, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        if(permanent)
          dns->timestamp = 0; /* mark as permanent */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache%s",
            hostname, port, addresses, permanent ? "" : " (non-permanent)");

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks",
              hostname, port);
        data->state.wildcard_resolve = true;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}